

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

void stbi__create_png_alpha_expand8(stbi_uc *dest,stbi_uc *src,stbi__uint32 x,int img_n)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (img_n == 1) {
    uVar3 = x * 2 - 1;
    for (iVar2 = 0; -1 < (int)((x - 1) + iVar2); iVar2 = iVar2 + -1) {
      dest[uVar3] = 0xff;
      dest[uVar3 - 1] = src[(x - 1) + iVar2 & 0x7fffffff];
      uVar3 = uVar3 - 2;
    }
  }
  else {
    if (img_n != 3) {
      __assert_fail("img_n == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                    ,0x124d,
                    "void stbi__create_png_alpha_expand8(stbi_uc *, stbi_uc *, stbi__uint32, int)");
    }
    uVar1 = (ulong)x * 3;
    iVar2 = x - 1;
    uVar3 = x * 4;
    while( true ) {
      uVar1 = uVar1 - 3;
      if (iVar2 < 0) break;
      dest[uVar3 - 1] = 0xff;
      uVar4 = uVar1 & 0xffffffff;
      dest[uVar3 - 2] = src[uVar4 + 2];
      dest[uVar3 - 3] = src[uVar4 + 1];
      dest[uVar3 - 4] = src[uVar4];
      iVar2 = iVar2 + -1;
      uVar3 = uVar3 - 4;
    }
  }
  return;
}

Assistant:

static void stbi__create_png_alpha_expand8(stbi_uc *dest, stbi_uc *src, stbi__uint32 x, int img_n)
{
   int i;
   // must process data backwards since we allow dest==src
   if (img_n == 1) {
      for (i=x-1; i >= 0; --i) {
         dest[i*2+1] = 255;
         dest[i*2+0] = src[i];
      }
   } else {
      STBI_ASSERT(img_n == 3);
      for (i=x-1; i >= 0; --i) {
         dest[i*4+3] = 255;
         dest[i*4+2] = src[i*3+2];
         dest[i*4+1] = src[i*3+1];
         dest[i*4+0] = src[i*3+0];
      }
   }
}